

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O1

void diy::
     reduce<void(*)(void*,diy::ReduceProxy_const&,diy::RegularSwapPartners_const&),diy::RegularSwapPartners,diy::detail::ReduceNeverSkip>
               (Master *master,Assigner *assigner,RegularSwapPartners *partners,
               _func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr **reduce,
               ReduceNeverSkip *skip)

{
  mapped_type *this;
  mapped_type *this_00;
  uint uVar1;
  int round_;
  ulong uVar2;
  int iVar3;
  vector<int,_std::allocator<int>_> incoming_gids;
  _Any_data local_188;
  code *local_178;
  code *pcStack_170;
  _Any_data local_168;
  code *local_158;
  code *pcStack_150;
  int local_144;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  _func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr **local_138;
  Assigner *local_130;
  int *local_128;
  IncomingRoundMap *local_120;
  ReductionFunctor<void,_diy::RegularSwapPartners> local_118;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  local_138 = reduce;
  local_130 = assigner;
  local_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_140->_M_use_count = 1;
  local_140->_M_weak_count = 1;
  local_140->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001cd370;
  local_144 = master->expected_;
  if ((partners->super_RegularPartners).kvs_.
      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (partners->super_RegularPartners).kvs_.
      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar1 = 0;
  }
  else {
    local_120 = &master->incoming_;
    local_128 = &master->exchange_round_;
    uVar2 = 0;
    do {
      local_178 = (code *)0x0;
      pcStack_170 = (code *)0x0;
      local_188._M_unused._M_object =
           (_func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr *)0x0;
      local_188._8_8_ = 0;
      if (*local_138 != (_func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr *)0x0) {
        pcStack_170 = Catch::clara::std::
                      _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
                      ::_M_invoke;
        local_178 = Catch::clara::std::
                    _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
                    ::_M_manager;
        local_188._M_unused._0_8_ = (undefined8)*local_138;
      }
      round_ = (int)uVar2;
      detail::ReductionFunctor<void,_diy::RegularSwapPartners>::ReductionFunctor
                (&local_118,round_,(Callback *)&local_188,partners,local_130);
      local_158 = (code *)0x0;
      pcStack_150 = (code *)0x0;
      local_168._M_unused._M_object = (void *)0x0;
      local_168._8_8_ = 0;
      local_168._M_unused._M_object = operator_new(0x18);
      *(int *)local_168._M_unused._0_8_ = round_;
      *(RegularSwapPartners **)((long)local_168._M_unused._0_8_ + 8) = partners;
      pcStack_150 = Catch::clara::std::
                    _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::ReduceNeverSkip>_>
                    ::_M_invoke;
      local_158 = Catch::clara::std::
                  _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::ReduceNeverSkip>_>
                  ::_M_manager;
      Master::foreach<diy::detail::ReductionFunctor<void,diy::RegularSwapPartners>>
                (master,&local_118,(Skip *)&local_168);
      if (local_158 != (code *)0x0) {
        (*local_158)(&local_168,&local_168,__destroy_functor);
      }
      if (local_118.partners.super_RegularPartners.steps_.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
          (pointer)0x0) {
        operator_delete(local_118.partners.super_RegularPartners.steps_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.partners.super_RegularPartners.steps_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.partners.super_RegularPartners.steps_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_118.partners.super_RegularPartners.kvs_.
          super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.partners.super_RegularPartners.kvs_.
                        super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.partners.super_RegularPartners.kvs_.
                              super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.partners.super_RegularPartners.kvs_.
                              super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_118.partners.super_RegularPartners.divisions_.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
          (pointer)0x0) {
        operator_delete(local_118.partners.super_RegularPartners.divisions_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.partners.super_RegularPartners.divisions_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.partners.super_RegularPartners.divisions_.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_118.reduce.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_118.reduce.super__Function_base._M_manager)
                  ((_Any_data *)&local_118.reduce,(_Any_data *)&local_118.reduce,__destroy_functor);
      }
      if (local_178 != (code *)0x0) {
        (*local_178)(&local_188,&local_188,__destroy_functor);
      }
      Master::execute(master);
      if ((int)((ulong)((long)(master->blocks_).elements_.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(master->blocks_).elements_.
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) == 0) {
        iVar3 = 0;
      }
      else {
        uVar1 = 0;
        iVar3 = 0;
        do {
          local_118._0_8_ = (pointer)0x0;
          local_118.reduce.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
          local_118.reduce.super__Function_base._M_functor._8_8_ = 0;
          RegularPartners::fill
                    (&partners->super_RegularPartners,round_,
                     (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar1],
                     (vector<int,_std::allocator<int>_> *)&local_118);
          uVar2 = (long)local_118.reduce.super__Function_base._M_functor._M_unused._0_8_ -
                  local_118._0_8_;
          local_188._0_4_ =
               (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar1];
          this = Catch::clara::std::
                 map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
                 ::operator[](local_120,local_128);
          this_00 = Catch::clara::std::
                    map<int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
                    ::operator[](&this->map,(key_type *)local_188._M_pod_data);
          concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
          ::clear(this_00);
          if ((pointer)local_118._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_118._0_8_,
                            local_118.reduce.super__Function_base._M_functor._8_8_ - local_118._0_8_
                           );
          }
          iVar3 = iVar3 + (int)(uVar2 >> 2);
          uVar1 = uVar1 + 1;
        } while (uVar1 < (uint)((ulong)((long)(master->blocks_).elements_.
                                              super__Vector_base<void_*,_std::allocator<void_*>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)(master->blocks_).elements_.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      master->expected_ = iVar3;
      local_98._M_unused._M_object = (void *)0x0;
      local_98._8_8_ = 0;
      pcStack_80 = Catch::clara::std::
                   _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                   ::_M_invoke;
      local_88 = Catch::clara::std::
                 _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                 ::_M_manager;
      local_78._M_unused._M_object = (void *)0x0;
      local_78._8_8_ = 0;
      pcStack_60 = Catch::clara::std::
                   _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                   ::_M_invoke;
      local_68 = Catch::clara::std::
                 _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                 ::_M_manager;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      pcStack_40 = Catch::clara::std::
                   _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                   ::_M_invoke;
      local_48 = Catch::clara::std::
                 _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                 ::_M_manager;
      Master::flush(master,false,(MemoryManagement *)&local_98);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      if (local_88 != (code *)0x0) {
        (*local_88)(&local_98,&local_98,__destroy_functor);
      }
      uVar1 = round_ + 1;
      uVar2 = (ulong)uVar1;
    } while (uVar2 < (ulong)((long)(partners->super_RegularPartners).kvs_.
                                   super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(partners->super_RegularPartners).kvs_.
                                   super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_178 = (code *)0x0;
  pcStack_170 = (code *)0x0;
  local_188._M_unused._M_object = (_func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr *)0x0
  ;
  local_188._8_8_ = 0;
  if (*local_138 != (_func_void_void_ptr_ReduceProxy_ptr_RegularSwapPartners_ptr *)0x0) {
    pcStack_170 = Catch::clara::std::
                  _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
                  ::_M_invoke;
    local_178 = Catch::clara::std::
                _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
                ::_M_manager;
    local_188._M_unused._0_8_ = (undefined8)*local_138;
  }
  detail::ReductionFunctor<void,_diy::RegularSwapPartners>::ReductionFunctor
            (&local_118,uVar1,(Callback *)&local_188,partners,local_130);
  local_158 = (code *)0x0;
  pcStack_150 = (code *)0x0;
  local_168._M_unused._M_object = (void *)0x0;
  local_168._8_8_ = 0;
  local_168._M_unused._M_object = operator_new(0x18);
  *(uint *)local_168._M_unused._0_8_ = uVar1;
  *(RegularSwapPartners **)((long)local_168._M_unused._0_8_ + 8) = partners;
  pcStack_150 = Catch::clara::std::
                _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::ReduceNeverSkip>_>
                ::_M_invoke;
  local_158 = Catch::clara::std::
              _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<diy::RegularSwapPartners,_diy::detail::ReduceNeverSkip>_>
              ::_M_manager;
  Master::foreach<diy::detail::ReductionFunctor<void,diy::RegularSwapPartners>>
            (master,&local_118,(Skip *)&local_168);
  if (local_158 != (code *)0x0) {
    (*local_158)(&local_168,&local_168,__destroy_functor);
  }
  if (local_118.partners.super_RegularPartners.steps_.super__Vector_base<int,_std::allocator<int>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.partners.super_RegularPartners.steps_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_118.partners.super_RegularPartners.steps_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_118.partners.super_RegularPartners.steps_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_118.partners.super_RegularPartners.kvs_.
      super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.partners.super_RegularPartners.kvs_.
                    super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.partners.super_RegularPartners.kvs_.
                          super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.partners.super_RegularPartners.kvs_.
                          super__Vector_base<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.partners.super_RegularPartners.divisions_.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_118.partners.super_RegularPartners.divisions_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)local_118.partners.super_RegularPartners.divisions_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)local_118.partners.super_RegularPartners.divisions_.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (local_118.reduce.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_118.reduce.super__Function_base._M_manager)
              ((_Any_data *)&local_118.reduce,(_Any_data *)&local_118.reduce,__destroy_functor);
  }
  if (local_178 != (code *)0x0) {
    (*local_178)(&local_188,&local_188,__destroy_functor);
  }
  master->expected_ = local_144;
  Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}